

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O1

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::exportKeys(KeyIndexStorage *__return_storage_ptr__,
            KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            *this,unsigned_long batchSize,string *keysFilename)

{
  element_type *peVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_4224UL,_void>
  it;
  path local_a8;
  long *local_78 [2];
  shared_ptr<supermap::io::FileManager> local_68;
  pointer local_58;
  pointer pcStack_50;
  size_type local_48;
  _Any_data local_40;
  code *local_30;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_a8,keysFilename,auto_format);
  peVar1 = (this->sortedStorage_).
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (peVar1->manager_).
          super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
              *)&local_40,&this->innerRegisterSupplier_);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ::SingleFileIndexedStorage
            (&__return_storage_ptr__->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
             ,&local_a8,&local_68,(InnerRegisterSupplier *)&local_40);
  (__return_storage_ptr__->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00207838;
  (__return_storage_ptr__->
  super_Findable<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00207880;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_a8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
  ::
  getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
              *)local_78);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,4224ul,void>
  ::
  collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::exportKeys(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>
            (&local_a8,local_78,batchSize);
  (*(__return_storage_ptr__->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(__return_storage_ptr__->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .register_,
             (this->sortedStorage_).
             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .
             super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .
             super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .register_.count_);
  if (local_a8._M_pathname._M_dataplus._M_p != (pointer)local_a8._M_pathname._M_string_length) {
    do {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
      ::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
                  *)__return_storage_ptr__);
      io::
      InputIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,4224ul,void>
      ::
      collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::exportKeys(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>&&,unsigned_long)_2_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>
                (&local_58,local_78,batchSize);
      uVar3 = local_a8._M_pathname.field_2._M_allocated_capacity;
      _Var2._M_p = local_a8._M_pathname._M_dataplus._M_p;
      local_a8._M_pathname._M_dataplus._M_p = local_58;
      local_a8._M_pathname._M_string_length = (size_type)pcStack_50;
      local_a8._M_pathname.field_2._M_allocated_capacity = local_48;
      local_58 = (pointer)0x0;
      pcStack_50 = (pointer)0x0;
      local_48 = 0;
      if (_Var2._M_p != (pointer)0x0) {
        operator_delete(_Var2._M_p,uVar3 - (long)_Var2._M_p);
      }
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
    } while (local_a8._M_pathname._M_dataplus._M_p != (pointer)local_a8._M_pathname._M_string_length
            );
  }
  if (local_a8._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity -
                    (long)local_a8._M_pathname._M_dataplus._M_p);
  }
  if (local_78[0] != (long *)0x0) {
    (**(code **)(*local_78[0] + 0x18))();
  }
  return __return_storage_ptr__;
}

Assistant:

KeyIndexStorage exportKeys(IndexT batchSize, const std::string &keysFilename) {
        KeyIndexStorage sortedIndex(keysFilename, getFileManager(), innerRegisterSupplier_);
        auto it = sortedStorage_.template getCustomDataIterator<ValueIgnorer>();
        auto keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
            return KeyIndex{std::move(kvi.key), ind};
        }, batchSize);
        sortedIndex.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!keys.empty()) {
            sortedIndex.appendAll(keys.cbegin(), keys.cend());
            keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
                return KeyIndex{std::move(kvi.key), ind};
            }, batchSize);
        }
        return sortedIndex;
    }